

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O1

int redisSetBlocking(redisContext *c,int blocking)

{
  uint uVar1;
  int iVar2;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *prefix;
  
  uVar1 = fcntl(c->fd,3);
  if (uVar1 == 0xffffffff) {
    iVar2 = 0x10b9ba;
    prefix = extraout_RDX;
  }
  else {
    iVar2 = fcntl(c->fd,4,(ulong)((uint)(blocking == 0) << 0xb | uVar1 & 0xfffff7ff));
    if (iVar2 != -1) {
      return 0;
    }
    iVar2 = 0x10b9c9;
    prefix = extraout_RDX_00;
  }
  __redisSetErrorFromErrno(c,iVar2,prefix);
  if ((c != (redisContext *)0x0) && (c->fd != -1)) {
    close(c->fd);
    c->fd = -1;
  }
  return -1;
}

Assistant:

static int redisSetBlocking(redisContext *c, int blocking) {
#ifndef _WIN32
    int flags;

    /* Set the socket nonblocking.
     * Note that fcntl(2) for F_GETFL and F_SETFL can't be
     * interrupted by a signal. */
    if ((flags = fcntl(c->fd, F_GETFL)) == -1) {
        __redisSetErrorFromErrno(c,REDIS_ERR_IO,"fcntl(F_GETFL)");
        redisNetClose(c);
        return REDIS_ERR;
    }

    if (blocking)
        flags &= ~O_NONBLOCK;
    else
        flags |= O_NONBLOCK;

    if (fcntl(c->fd, F_SETFL, flags) == -1) {
        __redisSetErrorFromErrno(c,REDIS_ERR_IO,"fcntl(F_SETFL)");
        redisNetClose(c);
        return REDIS_ERR;
    }
#else
    u_long mode = blocking ? 0 : 1;
    if (ioctl(c->fd, FIONBIO, &mode) == -1) {
        __redisSetErrorFromErrno(c, REDIS_ERR_IO, "ioctl(FIONBIO)");
        redisNetClose(c);
        return REDIS_ERR;
    }
#endif /* _WIN32 */
    return REDIS_OK;
}